

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cpp
# Opt level: O1

void __thiscall ftxui::Renderer::Impl::~Impl(Impl *this)

{
  _Manager_type *pp_Var1;
  _func_int **pp_Var2;
  
  (this->super_ComponentBase)._vptr_ComponentBase = (_func_int **)&PTR__Impl_00175638;
  pp_Var2 = this[1].super_ComponentBase._vptr_ComponentBase;
  if (pp_Var2 != (_func_int **)0x0) {
    pp_Var1 = &(this->render_).super__Function_base._M_manager;
    (*(code *)pp_Var2)(pp_Var1,pp_Var1,3);
  }
  ComponentBase::~ComponentBase(&this->super_ComponentBase);
  return;
}

Assistant:

Component Renderer(std::function<Element(bool)> render) {
  class Impl : public ComponentBase {
   public:
    Impl(std::function<Element(bool)> render) : render_(std::move(render)) {}

   private:
    Element Render() override { return render_(Focused()) | reflect(box_); }
    bool Focusable() const override { return true; }
    bool OnEvent(Event event) override {
      if (event.is_mouse() && box_.Contain(event.mouse().x, event.mouse().y)) {
        if (!CaptureMouse(event))
          return false;

        TakeFocus();
      }

      return false;
    }
    Box box_;

    std::function<Element(bool)> render_;
  };
  return Make<Impl>(std::move(render));
}